

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void NodeId_deleteMembers(UA_NodeId *p,UA_DataType *_)

{
  UA_DataType *__local;
  UA_NodeId *p_local;
  
  if ((p->identifierType == UA_NODEIDTYPE_STRING) || (p->identifierType == UA_NODEIDTYPE_BYTESTRING)
     ) {
    String_deleteMembers(&(p->identifier).string,(UA_DataType *)0x0);
  }
  return;
}

Assistant:

static void
NodeId_deleteMembers(UA_NodeId *p, const UA_DataType *_) {
    switch(p->identifierType) {
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
        String_deleteMembers(&p->identifier.string, NULL);
        break;
    default: break;
    }
}